

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O2

CommaSeparatedList * __thiscall
soul::StructuralParser::parseCommaSeparatedListOfExpressions
          (StructuralParser *this,bool canContainTypes,bool canContainProcessors)

{
  ExpressionKind EVar1;
  bool bVar2;
  CommaSeparatedList *pCVar3;
  SourceCodeText *pSVar4;
  Context local_f0;
  CompileMessage local_d8;
  CompileMessage local_a0;
  CompileMessage local_68;
  
  getContext(&local_f0,this);
  pCVar3 = allocate<soul::AST::CommaSeparatedList,soul::AST::Context>(this,&local_f0);
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
            ((RefCountedPtr<soul::SourceCodeText> *)&local_f0);
  bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x299119);
  if (!bVar2) {
    while( true ) {
      pSVar4 = (SourceCodeText *)parseExpression(this,false);
      if (0xffff < (pCVar3->items).numActive) {
        Errors::tooManyInitialisers<>();
        AST::Context::throwError((Context *)&(pSVar4->filename)._M_string_length,&local_68,false);
      }
      EVar1 = *(ExpressionKind *)&(pSVar4->content)._M_dataplus._M_p;
      if (EVar1 == type && !canContainTypes) {
        Errors::typeReferenceNotAllowed<>();
        AST::Context::throwError((Context *)&(pSVar4->filename)._M_string_length,&local_a0,false);
      }
      if (EVar1 == processor && !canContainProcessors) {
        Errors::processorReferenceNotAllowed<>();
        AST::Context::throwError((Context *)&(pSVar4->filename)._M_string_length,&local_d8,false);
      }
      local_f0.location.sourceCode.object = pSVar4;
      ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::push_back
                (&pCVar3->items,(pool_ref<soul::AST::Expression> *)&local_f0);
      bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x299119);
      if (bVar2) break;
      Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
      ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x275d9e);
    }
  }
  return pCVar3;
}

Assistant:

AST::CommaSeparatedList& parseCommaSeparatedListOfExpressions (bool canContainTypes, bool canContainProcessors)
    {
        auto& list = allocate<AST::CommaSeparatedList> (getContext());

        if (! matchIf (Operator::closeParen))
        {
            for (;;)
            {
                auto& e = parseExpression();

                if (list.items.size() >= AST::maxInitialiserListLength)
                    e.context.throwError (Errors::tooManyInitialisers());

                if (! canContainTypes && e.kind == AST::ExpressionKind::type)
                    e.context.throwError (Errors::typeReferenceNotAllowed());

                if (! canContainProcessors && e.kind == AST::ExpressionKind::processor)
                    e.context.throwError (Errors::processorReferenceNotAllowed());

                list.items.push_back (e);

                if (matchIf (Operator::closeParen))
                    break;

                expect (Operator::comma);
            }
        }

        return list;
    }